

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeDepSchema
          (Impl *this,uint64_t typeId,Which whichType,Which expectedKind,Reader brand,
          StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  Reader brand_00;
  StringPtr scopeName_00;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_a0;
  char *local_88;
  size_t sStack_80;
  SegmentReader *local_78;
  CapTableReader *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  int iStack_50;
  undefined4 uStack_4c;
  undefined1 auStack_48 [8];
  Binding binding;
  Which expectedKind_local;
  Which whichType_local;
  uint64_t typeId_local;
  Impl *this_local;
  StringPtr scopeName_local;
  
  sStack_80 = scopeName.content.size_;
  local_88 = scopeName.content.ptr;
  auStack_48[0] = '\0';
  auStack_48[1] = false;
  auStack_48._2_2_ = 0;
  auStack_48._4_2_ = 0;
  auStack_48._6_2_ = 0;
  binding.which = '\0';
  binding.isImplicitParameter = false;
  binding.listDepth = 0;
  binding.paramIndex = 0;
  binding._6_2_ = 0;
  local_58 = brand._reader.dataSize;
  SStack_54 = brand._reader.pointerCount;
  uStack_52 = brand._reader._38_2_;
  iStack_50 = brand._reader.nestingLimit;
  uStack_4c = brand._reader._44_4_;
  local_68 = brand._reader.data;
  pWStack_60 = brand._reader.pointers;
  local_78 = brand._reader.segment;
  pCStack_70 = brand._reader.capTable;
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_a0,brandBindings);
  brand_00._reader.capTable = pCStack_70;
  brand_00._reader.segment = local_78;
  brand_00._reader.data = local_68;
  brand_00._reader.pointers = pWStack_60;
  brand_00._reader.dataSize = local_58;
  brand_00._reader.pointerCount = SStack_54;
  brand_00._reader._38_2_ = uStack_52;
  brand_00._reader.nestingLimit = iStack_50;
  brand_00._reader._44_4_ = uStack_4c;
  scopeName_00.content.size_ = sStack_80;
  scopeName_00.content.ptr = local_88;
  makeDep(this,(Binding *)auStack_48,typeId,whichType,expectedKind,brand_00,scopeName_00,&local_a0);
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_a0);
  return (RawBrandedSchema *)binding._0_8_;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeDepSchema(
    uint64_t typeId, schema::Type::Which whichType, schema::Node::Which expectedKind,
    schema::Brand::Reader brand, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  _::RawBrandedSchema::Binding binding;
  memset(&binding, 0, sizeof(binding));
  makeDep(binding, typeId, whichType, expectedKind, brand, scopeName, brandBindings);
  return binding.schema;
}